

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

_Bool rtr_mgr_config_status_is_synced(rtr_mgr_group *group)

{
  rtr_socket_state rVar1;
  long in_FS_OFFSET;
  uint local_24;
  rtr_socket_state state;
  uint i;
  rtr_mgr_group *group_local;
  
  local_24 = 0;
  do {
    if (group->sockets_len <= local_24) {
      group_local._7_1_ = true;
LAB_001084ee:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return group_local._7_1_;
      }
      __stack_chk_fail();
    }
    rVar1 = group->sockets[local_24]->state;
    if ((group->sockets[local_24]->last_update == 0) ||
       (((rVar1 != RTR_ESTABLISHED && (rVar1 != RTR_RESET)) && (rVar1 != RTR_SYNC)))) {
      group_local._7_1_ = false;
      goto LAB_001084ee;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool rtr_mgr_config_status_is_synced(const struct rtr_mgr_group *group)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		enum rtr_socket_state state = group->sockets[i]->state;

		if ((group->sockets[i]->last_update == 0) ||
		    ((state != RTR_ESTABLISHED) && (state != RTR_RESET) && (state != RTR_SYNC)))
			return false;
	}
	return true;
}